

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

AstNode * has_function_call(AstNode *expr)

{
  AstNodeList *list;
  
  if (expr == (AstNode *)0x0) {
    return (AstNode *)0x0;
  }
  do {
    if (expr->type != EXPR_SUFFIXED) {
      if (expr->type != EXPR_FUNCTION_CALL) {
        return (AstNode *)0x0;
      }
      return expr;
    }
    list = (expr->field_2).for_stmt.for_statement_list;
    if (list == (AstNodeList *)0x0) {
      expr = (expr->field_2).function_stmt.function_expr;
    }
    else {
      expr = (AstNode *)raviX_ptrlist_last((PtrList *)list);
    }
  } while (expr != (AstNode *)0x0);
  return (AstNode *)0x0;
}

Assistant:

static AstNode *has_function_call(AstNode *expr)
{
	if (!expr)
		return NULL;
	if (expr->type == EXPR_FUNCTION_CALL)
		return expr;
	else if (expr->type == EXPR_SUFFIXED) {
		if (expr->suffixed_expr.suffix_list) {
			return has_function_call(
			    (AstNode *)raviX_ptrlist_last((PtrList *)expr->suffixed_expr.suffix_list));
		} else {
			return has_function_call(expr->suffixed_expr.primary_expr);
		}
	} else {
		return NULL;
	}
}